

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

VerificationResult * __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageCount
          (VerificationResult *__return_storage_ptr__,BaseCase *this,MessageID *id,GLenum severity,
          int refCount,int resCount,bool messageEnabled)

{
  ostream *poVar1;
  Enum<int,_2UL> EVar2;
  bool local_5fb;
  bool local_5fa;
  bool local_5f9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  GetNameFunc local_5a0;
  int local_598;
  Enum<int,_2UL> local_590;
  string local_580;
  allocator<char> local_559;
  string local_558;
  GetNameFunc local_538;
  int local_530;
  Enum<int,_2UL> local_528;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  GetNameFunc local_4d0;
  int local_4c8;
  Enum<int,_2UL> local_4c0;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  GetNameFunc local_468;
  int local_460;
  Enum<int,_2UL> local_458;
  string local_448;
  allocator<char> local_421;
  string local_420;
  GetNameFunc local_400;
  int local_3f8;
  Enum<int,_2UL> local_3f0;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  GetNameFunc local_398;
  int local_390;
  Enum<int,_2UL> local_388;
  string local_378;
  allocator<char> local_351;
  string local_350;
  GetNameFunc local_330;
  int local_328;
  Enum<int,_2UL> local_320;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  GetNameFunc local_2c8;
  int local_2c0;
  Enum<int,_2UL> local_2b8;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  GetNameFunc local_260;
  int local_258;
  Enum<int,_2UL> local_250;
  undefined4 local_23c;
  string local_238;
  allocator<char> local_211;
  string local_210;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0 [2];
  bool local_1ba;
  bool local_1b9;
  stringstream local_1b8 [6];
  bool canIgnore;
  bool isDeterministic;
  stringstream log;
  ostream local_1a8 [379];
  byte local_2d;
  int local_2c;
  int iStack_28;
  bool messageEnabled_local;
  int resCount_local;
  int refCount_local;
  GLenum severity_local;
  MessageID *id_local;
  BaseCase *this_local;
  
  local_2d = messageEnabled;
  local_2c = resCount;
  iStack_28 = refCount;
  resCount_local = severity;
  _refCount_local = id;
  id_local = (MessageID *)this;
  this_local = (BaseCase *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((local_2d & 1) == 0) {
    if (local_2c == 0) {
      poVar1 = std::operator<<(local_1a8,"Message was excluded correctly:  (");
      poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
      poVar1 = std::operator<<(poVar1,") with ");
      EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
      local_4d0 = EVar2.m_getName;
      local_4c8 = EVar2.m_value;
      local_4c0.m_getName = local_4d0;
      local_4c0.m_value = local_4c8;
      tcu::Format::operator<<(poVar1,&local_4c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"",&local_4f1);
      std::__cxx11::stringstream::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_4f0,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator(&local_4f1);
    }
    else if ((local_2c < 1) || (iStack_28 != 0)) {
      poVar1 = std::operator<<(local_1a8,"A message was not excluded as it should have been: (");
      poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
      poVar1 = std::operator<<(poVar1,") with ");
      EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
      local_5a0 = EVar2.m_getName;
      local_598 = EVar2.m_value;
      local_590.m_getName = local_5a0;
      local_590.m_value = local_598;
      tcu::Format::operator<<(poVar1,&local_590);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c0,"A message was not filtered out",&local_5c1);
      std::__cxx11::stringstream::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_5c0,&local_5e8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
    }
    else {
      poVar1 = std::operator<<(local_1a8,"A message was not excluded as it should have been: (");
      poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
      poVar1 = std::operator<<(poVar1,") with ");
      EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
      local_538 = EVar2.m_getName;
      local_530 = EVar2.m_value;
      local_528.m_getName = local_538;
      local_528.m_value = local_530;
      poVar1 = tcu::Format::operator<<(poVar1,&local_528);
      std::operator<<(poVar1,". This message was not present in the reference run");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"A message was not filtered out",&local_559);
      std::__cxx11::stringstream::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_558,&local_580);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
    }
  }
  else if (local_2c == iStack_28) {
    poVar1 = std::operator<<(local_1a8,"Message was found when expected: (");
    poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
    poVar1 = std::operator<<(poVar1,") with ");
    EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
    local_468 = EVar2.m_getName;
    local_460 = EVar2.m_value;
    local_458.m_getName = local_468;
    local_458.m_value = local_460;
    tcu::Format::operator<<(poVar1,&local_458);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_489);
    std::__cxx11::stringstream::str();
    VerificationResult::VerificationResult
              (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_488,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
  }
  else {
    local_5f9 = true;
    if ((_refCount_local->source != 0x824a) && (local_5f9 = true, _refCount_local->source != 0x8249)
       ) {
      if ((_refCount_local->source == 0x8246) ||
         (local_5fa = false, _refCount_local->source == 0x8248)) {
        local_5fa = _refCount_local->type == 0x824c;
      }
      local_5f9 = local_5fa;
    }
    local_1b9 = local_5f9;
    local_5fb = true;
    if (_refCount_local->source != 0x8247) {
      local_5fb = _refCount_local->source == 0x824b;
    }
    local_1ba = local_5fb;
    if (local_5f9 == false) {
      if (local_5fb == false) {
        if (iStack_28 < local_2c) {
          poVar1 = std::operator<<(local_1a8,
                                   "Extra instances of message were found but the message is non-deterministic(warning): ("
                                  );
          poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
          poVar1 = std::operator<<(poVar1,") with ");
          EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
          local_2c8 = EVar2.m_getName;
          local_2c0 = EVar2.m_value;
          local_2b8.m_getName = local_2c8;
          local_2b8.m_value = local_2c0;
          poVar1 = tcu::Format::operator<<(poVar1,&local_2b8);
          poVar1 = std::operator<<(poVar1," (got ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
          poVar1 = std::operator<<(poVar1,", expected ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_28);
          std::operator<<(poVar1,")");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"Extra instances of a message were present",&local_2e9);
          std::__cxx11::stringstream::str();
          VerificationResult::VerificationResult
                    (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_2e8,&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator(&local_2e9);
        }
        else {
          poVar1 = std::operator<<(local_1a8,
                                   "Instances of message were missing but the message is non-deterministic(warning): ("
                                  );
          poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
          poVar1 = std::operator<<(poVar1,") with ");
          EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
          local_330 = EVar2.m_getName;
          local_328 = EVar2.m_value;
          local_320.m_getName = local_330;
          local_320.m_value = local_328;
          poVar1 = tcu::Format::operator<<(poVar1,&local_320);
          poVar1 = std::operator<<(poVar1," (got ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
          poVar1 = std::operator<<(poVar1,", expected ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_28);
          std::operator<<(poVar1,")");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,"Message missing",&local_351);
          std::__cxx11::stringstream::str();
          VerificationResult::VerificationResult
                    (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_350,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_350);
          std::allocator<char>::~allocator(&local_351);
        }
      }
      else if (iStack_28 < local_2c) {
        poVar1 = std::operator<<(local_1a8,
                                 "Extra instances of message were found but the message is non-deterministic(ignored): ("
                                );
        poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
        poVar1 = std::operator<<(poVar1,") with ");
        EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
        local_398 = EVar2.m_getName;
        local_390 = EVar2.m_value;
        local_388.m_getName = local_398;
        local_388.m_value = local_390;
        poVar1 = tcu::Format::operator<<(poVar1,&local_388);
        poVar1 = std::operator<<(poVar1," (got ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
        poVar1 = std::operator<<(poVar1,", expected ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_28);
        std::operator<<(poVar1,")");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_3b9);
        std::__cxx11::stringstream::str();
        VerificationResult::VerificationResult
                  (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_3b8,&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator(&local_3b9);
      }
      else {
        poVar1 = std::operator<<(local_1a8,
                                 "Instances of message were missing but the message is non-deterministic(ignored): ("
                                );
        poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
        poVar1 = std::operator<<(poVar1,") with ");
        EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
        local_400 = EVar2.m_getName;
        local_3f8 = EVar2.m_value;
        local_3f0.m_getName = local_400;
        local_3f0.m_value = local_3f8;
        poVar1 = tcu::Format::operator<<(poVar1,&local_3f0);
        poVar1 = std::operator<<(poVar1," (got ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
        poVar1 = std::operator<<(poVar1,", expected ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_28);
        std::operator<<(poVar1,")");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"",&local_421);
        std::__cxx11::stringstream::str();
        VerificationResult::VerificationResult
                  (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_420,&local_448);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_420);
        std::allocator<char>::~allocator(&local_421);
      }
    }
    else if (iStack_28 < local_2c) {
      poVar1 = std::operator<<(local_1a8,"Extra instances of message were found: (");
      poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
      poVar1 = std::operator<<(poVar1,") with ");
      EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
      local_1f0 = EVar2.m_getName;
      local_1e8 = EVar2.m_value;
      local_1e0[0].m_getName = local_1f0;
      local_1e0[0].m_value = local_1e8;
      poVar1 = tcu::Format::operator<<(poVar1,local_1e0);
      poVar1 = std::operator<<(poVar1," (got ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
      poVar1 = std::operator<<(poVar1,", expected ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_28);
      std::operator<<(poVar1,")");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"Extra instances of a deterministic message were present",
                 &local_211);
      std::__cxx11::stringstream::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_210,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    else {
      poVar1 = std::operator<<(local_1a8,"Instances of message were missing: (");
      poVar1 = anon_unknown_1::operator<<(poVar1,_refCount_local);
      poVar1 = std::operator<<(poVar1,") with ");
      EVar2 = glu::getDebugMessageSeverityStr(resCount_local);
      local_260 = EVar2.m_getName;
      local_258 = EVar2.m_value;
      local_250.m_getName = local_260;
      local_250.m_value = local_258;
      poVar1 = tcu::Format::operator<<(poVar1,&local_250);
      poVar1 = std::operator<<(poVar1," (got ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
      poVar1 = std::operator<<(poVar1,", expected ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_28);
      std::operator<<(poVar1,")");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"Message missing",&local_281);
      std::__cxx11::stringstream::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_280,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
    }
  }
  local_23c = 1;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

BaseCase::VerificationResult BaseCase::verifyMessageCount (const MessageID& id, GLenum severity, int refCount, int resCount, bool messageEnabled) const
{
	std::stringstream log;

	// This message should not be filtered out
	if (messageEnabled)
	{
		if (resCount != refCount)
		{
			/*
			 * Technically nothing requires the implementation to be consistent in terms
			 * of the messages it produces in most situations, allowing the set of messages
			 * produced to vary between executions. This function splits messages
			 * into deterministic and non-deterministic to facilitate handling of such messages.
			 *
			 * Non-deterministic messages that are present in differing quantities in filtered and
			 * unfiltered runs will not fail the test case unless in direct violation of a filter:
			 * the implementation may produce an arbitrary number of such messages when they are
			 * not filtered out and none when they are filtered.
			 *
			 * A list of error source/type combinations with their assumed behaviour and
			 * the rationale for expecting such behaviour follows
			 *
			 * For API/shader messages we assume that the following types are deterministic:
			 *   DEBUG_TYPE_ERROR                 Errors specified by spec and should always be produced
			 *
			 * For API messages the following types are assumed to be non-deterministic
			 * and treated as quality warnings since the underlying reported issue does not change between calls:
			 *   DEBUG_TYPE_DEPRECATED_BEHAVIOR   Reasonable to only report first instance
             *   DEBUG_TYPE_UNDEFINED_BEHAVIOR    Reasonable to only report first instance
             *   DEBUG_TYPE_PORTABILITY           Reasonable to only report first instance
			 *
			 * For API messages the following types are assumed to be non-deterministic
			 * and do not affect test results.
			 *   DEBUG_TYPE_PERFORMANCE           May be tied to arbitrary factors, reasonable to report only first instance
             *   DEBUG_TYPE_OTHER                 Definition allows arbitrary contents
			 *
			 * For 3rd party and application messages the following types are deterministic:
             *   DEBUG_TYPE_MARKER                Only generated by test
			 *   DEBUG_TYPE_PUSH_GROUP            Only generated by test
			 *   DEBUG_TYPE_POP_GROUP             Only generated by test
			 *   All others                       Only generated by test
			 *
			 * All messages with category of window system or other are treated as non-deterministic
			 * and do not effect test results since they can be assumed to be outside control of
			 * both the implementation and test case
			 *
			 */

			const bool isDeterministic	= id.source == GL_DEBUG_SOURCE_APPLICATION ||
										  id.source == GL_DEBUG_SOURCE_THIRD_PARTY ||
										  ((id.source == GL_DEBUG_SOURCE_API || id.source == GL_DEBUG_SOURCE_SHADER_COMPILER) && id.type == GL_DEBUG_TYPE_ERROR);

			const bool canIgnore		= id.source == GL_DEBUG_SOURCE_WINDOW_SYSTEM || id.source == GL_DEBUG_SOURCE_OTHER;

			if (isDeterministic)
			{
				if (resCount > refCount)
				{
					log << "Extra instances of message were found: (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_FAIL, "Extra instances of a deterministic message were present", log.str());
				}
				else
				{
					log << "Instances of message were missing: (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_FAIL, "Message missing", log.str());
				}
			}
			else if(!canIgnore)
			{
				if (resCount > refCount)
				{
					log << "Extra instances of message were found but the message is non-deterministic(warning): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_QUALITY_WARNING, "Extra instances of a message were present", log.str());
				}
				else
				{
					log << "Instances of message were missing but the message is non-deterministic(warning): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_QUALITY_WARNING, "Message missing", log.str());
				}
			}
			else
			{
				if (resCount > refCount)
				{
					log << "Extra instances of message were found but the message is non-deterministic(ignored): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
				}
				else
				{
					log << "Instances of message were missing but the message is non-deterministic(ignored): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
				}
			}
		}
		else // Passed as appropriate
		{
			log << "Message was found when expected: ("<< id << ") with "
				<< glu::getDebugMessageSeverityStr(severity);
			return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
		}
	}
	// Message should be filtered out
	else
	{
		// Filtered out
		if (resCount == 0)
		{
			log << "Message was excluded correctly:  (" << id << ") with "
				<< glu::getDebugMessageSeverityStr(severity);
			return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
		}
		// Only present in filtered run (ERROR)
		else if (resCount > 0 && refCount == 0)
		{
			log << "A message was not excluded as it should have been: (" << id << ") with "
				<< glu::getDebugMessageSeverityStr(severity)
				<< ". This message was not present in the reference run";
			return VerificationResult(QP_TEST_RESULT_FAIL, "A message was not filtered out", log.str());
		}
		// Present in both runs (ERROR)
		else
		{
			log << "A message was not excluded as it should have been: (" << id << ") with "
				<< glu::getDebugMessageSeverityStr(severity);
			return VerificationResult(QP_TEST_RESULT_FAIL, "A message was not filtered out", log.str());
		}
	}
}